

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_privkey.cc
# Opt level: O0

bool set_sigalg_prefs(Array<unsigned_short> *out,Span<const_unsigned_short> prefs)

{
  uint16_t sigalg;
  bool bVar1;
  size_t new_size;
  iterator puVar2;
  SSL_SIGNATURE_ALGORITHM *pSVar3;
  unsigned_short *puVar4;
  uint16_t pref;
  iterator __end1;
  iterator __begin1;
  Span<const_unsigned_short> *__range1;
  size_t added;
  undefined1 local_48 [8];
  Array<unsigned_short> filtered;
  Array<unsigned_short> *out_local;
  Span<const_unsigned_short> prefs_local;
  
  prefs_local.data_ = (unsigned_short *)prefs.size_;
  filtered.size_ = (size_t)prefs.data_;
  out_local = (Array<unsigned_short> *)filtered.size_;
  bVar1 = sigalgs_unique(prefs);
  if (bVar1) {
    bssl::Array<unsigned_short>::Array((Array<unsigned_short> *)local_48);
    new_size = bssl::Span<const_unsigned_short>::size((Span<const_unsigned_short> *)&out_local);
    bVar1 = bssl::Array<unsigned_short>::InitForOverwrite
                      ((Array<unsigned_short> *)local_48,new_size);
    if (bVar1) {
      __range1 = (Span<const_unsigned_short> *)0x0;
      __end1 = bssl::Span<const_unsigned_short>::begin((Span<const_unsigned_short> *)&out_local);
      puVar2 = bssl::Span<const_unsigned_short>::end((Span<const_unsigned_short> *)&out_local);
      for (; __end1 != puVar2; __end1 = __end1 + 1) {
        sigalg = *__end1;
        if (sigalg != 0xff01) {
          pSVar3 = bssl::get_signature_algorithm(sigalg);
          if (pSVar3 == (SSL_SIGNATURE_ALGORITHM *)0x0) {
            ERR_put_error(0x10,0,0x127,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                          ,0x233);
            prefs_local.size_._7_1_ = 0;
            goto LAB_001b2c42;
          }
          puVar4 = bssl::Array<unsigned_short>::operator[]
                             ((Array<unsigned_short> *)local_48,(size_t)__range1);
          *puVar4 = sigalg;
          __range1 = (Span<const_unsigned_short> *)((long)&__range1->data_ + 1);
        }
      }
      bssl::Array<unsigned_short>::Shrink((Array<unsigned_short> *)local_48,(size_t)__range1);
      bVar1 = bssl::Span<const_unsigned_short>::empty((Span<const_unsigned_short> *)&out_local);
      if ((bVar1) ||
         (bVar1 = bssl::Array<unsigned_short>::empty((Array<unsigned_short> *)local_48), !bVar1)) {
        bssl::Array<unsigned_short>::operator=(out,(Array<unsigned_short> *)local_48);
        prefs_local.size_._7_1_ = 1;
      }
      else {
        ERR_put_error(0x10,0,0x127,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                      ,0x23f);
        prefs_local.size_._7_1_ = 0;
      }
    }
    else {
      prefs_local.size_._7_1_ = 0;
    }
LAB_001b2c42:
    bssl::Array<unsigned_short>::~Array((Array<unsigned_short> *)local_48);
  }
  else {
    prefs_local.size_._7_1_ = 0;
  }
  return (bool)(prefs_local.size_._7_1_ & 1);
}

Assistant:

static bool set_sigalg_prefs(Array<uint16_t> *out, Span<const uint16_t> prefs) {
  if (!sigalgs_unique(prefs)) {
    return false;
  }

  // Check for invalid algorithms, and filter out |SSL_SIGN_RSA_PKCS1_MD5_SHA1|.
  Array<uint16_t> filtered;
  if (!filtered.InitForOverwrite(prefs.size())) {
    return false;
  }
  size_t added = 0;
  for (uint16_t pref : prefs) {
    if (pref == SSL_SIGN_RSA_PKCS1_MD5_SHA1) {
      // Though not intended to be used with this API, we treat
      // |SSL_SIGN_RSA_PKCS1_MD5_SHA1| as a real signature algorithm in
      // |SSL_PRIVATE_KEY_METHOD|. Not accepting it here makes for a confusing
      // abstraction.
      continue;
    }
    if (get_signature_algorithm(pref) == nullptr) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SIGNATURE_ALGORITHM);
      return false;
    }
    filtered[added] = pref;
    added++;
  }
  filtered.Shrink(added);

  // This can happen if |prefs| contained only |SSL_SIGN_RSA_PKCS1_MD5_SHA1|.
  // Leaving it empty would revert to the default, so treat this as an error
  // condition.
  if (!prefs.empty() && filtered.empty()) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SIGNATURE_ALGORITHM);
    return false;
  }

  *out = std::move(filtered);
  return true;
}